

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O0

void init_ifpage(uint sysout_size)

{
  DLword DVar1;
  uint uVar2;
  __uid_t __uid;
  long lVar3;
  passwd *ppVar4;
  DLword *pDVar5;
  size_t sVar6;
  int local_28;
  int len;
  char *s;
  passwd *pwd;
  uint new_lastvmem;
  uint sysout_size_local;
  
  InterfacePage->machinetype = 3;
  DVar1 = 0xffff;
  if (sysout_size == 8) {
    DVar1 = 0;
  }
  InterfacePage->dl24bitaddressable = DVar1;
  uVar2 = sysout_size * 0x800 - 1;
  if ((Storage_expanded == 0) && (InterfacePage->dllastvmempage != uVar2)) {
    fprintf(_stderr,"You can\'t expand VMEM\n");
    exit(-1);
  }
  InterfacePage->dllastvmempage = uVar2;
  *STORAGEFULL_word = 0;
  InterfacePage->process_size = sysout_size;
  *LASTVMEMFILEPAGE_word = InterfacePage->dllastvmempage;
  lVar3 = gethostid();
  InterfacePage->serialnumber = (DLword)lVar3;
  InterfacePage->usernameaddr = 0;
  __uid = getuid();
  ppVar4 = getpwuid(__uid);
  if (ppVar4 != (passwd *)0x0) {
    InterfacePage->usernameaddr = 0xda01;
    pDVar5 = NativeAligned2FromLAddr((uint)InterfacePage->usernameaddr);
    sVar6 = strlen(ppVar4->pw_name);
    local_28 = (int)sVar6;
    if (0x3f < local_28) {
      local_28 = 0x3f;
    }
    *(char *)pDVar5 = (char)local_28;
    strncpy((char *)((long)pDVar5 + 1),ppVar4->pw_name,(long)local_28);
    pDVar5 = NativeAligned2FromLAddr(0xda00);
    word_swap_page(pDVar5,(local_28 + 6) / 4);
  }
  InterfacePage->rversion = 0x358c;
  InterfacePage->devconfig = InterfacePage->devconfig & 0xff87;
  InterfacePage->devconfig = InterfacePage->devconfig | (ushort)DisplayType;
  return;
}

Assistant:

void init_ifpage(unsigned sysout_size) {
  extern const time_t MDate;
  extern int DisplayType;
  extern int Storage_expanded;
  unsigned new_lastvmem;
  /*
    Initialize IFPAGE
   */
  InterfacePage->machinetype = MACHINETYPE_MAIKO;
#if defined(MAIKO_ENABLE_ETHERNET) || defined(MAIKO_ENABLE_NETHUB)
  init_ifpage_ether(); /* store ethernet ID in IF page */
#endif /* MAIKO_ENABLE_ETHERNET or MAIKO_ENABLE_NETHUB */
  /*InterfacePage->dl24bitaddressable = (sysout_size == 32? 0xffff : 0);*/
  InterfacePage->dl24bitaddressable = (sysout_size == 8 ? 0 : 0xffff);
  new_lastvmem = (sysout_size * PAGES_IN_MBYTE) - 1;

  if ((!Storage_expanded) && (InterfacePage->dllastvmempage != new_lastvmem)) {
    (void)fprintf(stderr, "You can't expand VMEM\n");
    exit(-1);
  } else { /* Set value which will be set to \\LASTVMEMFILEPAGE in LISP */
    InterfacePage->dllastvmempage = new_lastvmem;
    /* Also you can expand lisp space even if \\STOAGEFULL was T */
    *STORAGEFULL_word = NIL;
  }
  /* Set current process size */
  InterfacePage->process_size = sysout_size;

#ifdef BIGVM
  /* For BIGVM system, save the value in \LASTVMEMFILEPAGE for lisp's use */
  *LASTVMEMFILEPAGE_word = InterfacePage->dllastvmempage;
#endif /* BIGVM */

  /* unfortunately, Lisp only looks at a 16 bit serial number */
#if !defined(DOS) && !defined(MAIKO_OS_HAIKU)
  InterfacePage->serialnumber = 0xffff & gethostid();
#endif /* DOS MAIKO_OS_HAIKU */

/* get user name and stuff into vmem; this is the VMEM buffer;
This is a BCPL string -- it starts with a length count. C strings
are null terminated instead */
  InterfacePage->usernameaddr = 0;
#ifndef DOS
  {
    struct passwd *pwd;
    char *s;
    int len;
    /* Get username from getpwuid */
    /* The page/offset we are using is hardcoded in LLFAULT in functions */
    /*  \MAIKO.NEWFAULTINIT and \MAIKO.ASSIGNBUFFERS */
    if ((pwd = getpwuid(getuid())) != NULL) {
      InterfacePage->usernameaddr = 0155001;
      s = (char *)NativeAligned2FromLAddr(InterfacePage->usernameaddr);
      len = (int)strlen(pwd->pw_name);
      /* Lisp reserves 32 words for the BCPL String */
      len = (len < 32 * BYTESPER_DLWORD) ? len : 32 * BYTESPER_DLWORD - 1;
      *s = (char)len;
      strncpy(s + 1, pwd->pw_name, len);
#ifdef BYTESWAP
      /* we must swap the area we have written into, starting at 0155000 */
      /* rounding up to 4-byte words					 */
      word_swap_page(NativeAligned2FromLAddr(0155000), (len + 1 + 2 + 3) / 4);
#endif
    }

  }
#endif /* DOS */

  /* Days from Oct-13-87 12:00  It's Takeshi's birthday. */
  /* MDate may be set by vdate.c, generated by mkvdate.c. */
  InterfacePage->rversion = (MDate - 561150000) / (60 * 60 * 24);

  /* For DisplayType ,I couldn't insert this line into init_display */
  InterfacePage->devconfig &= 0xff87;
  InterfacePage->devconfig |= DisplayType;
}